

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2OctalTests(void)

{
  bool bVar1;
  short v;
  Arg *args [1];
  short local_1d0;
  undefined2 uStack_1ce;
  undefined4 uStack_1cc;
  Arg *local_1c8;
  Arg local_1c0;
  StringPiece local_1b0;
  LogMessage local_1a0;
  
  RE2::RE2((RE2 *)&local_1a0,"([0-7]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_short_octal;
  local_1b0.ptr_ = "77777";
  local_1b0.length_ = 5;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3b,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"77777\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))",0x48);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (local_1d0 != 0x7fff) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3b,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (077777)",0x1d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-9a-fA-FxX]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_short_cradix;
  local_1b0.ptr_ = "077777";
  local_1b0.length_ = 6;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3b,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"0\" \"77777\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
               ,0x55);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (local_1d0 != 0x7fff) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3b,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (077777)",0x1d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-7]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_ushort_octal;
  local_1b0.ptr_ = "177777U";
  local_1b0.length_ = 7;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"177777U\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))",0x4a
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (local_1d0 != -1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (0177777U)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-9a-fA-FxX]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_ushort_cradix;
  local_1b0.ptr_ = "0177777U";
  local_1b0.length_ = 8;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"0\" \"177777U\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
               ,0x57);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (local_1d0 != -1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (0177777U)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-7]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_int_octal;
  local_1b0.ptr_ = "17777777777";
  local_1b0.length_ = 0xb;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"17777777777\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))",
               0x4e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (CONCAT22(uStack_1ce,local_1d0) != 0x7fffffff) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (017777777777)",0x23);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-9a-fA-FxX]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_int_cradix;
  local_1b0.ptr_ = "017777777777";
  local_1b0.length_ = 0xc;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"0\" \"17777777777\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
               ,0x5b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (CONCAT22(uStack_1ce,local_1d0) != 0x7fffffff) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (017777777777)",0x23);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-7]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_uint_octal;
  local_1b0.ptr_ = "37777777777U";
  local_1b0.length_ = 0xc;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"37777777777U\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))"
               ,0x4f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (CONCAT22(uStack_1ce,local_1d0) != -1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (037777777777U)",0x24);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-9a-fA-FxX]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_uint_cradix;
  local_1b0.ptr_ = "037777777777U";
  local_1b0.length_ = 0xd;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"0\" \"37777777777U\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
               ,0x5c);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (CONCAT22(uStack_1ce,local_1d0) != -1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (037777777777U)",0x24);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-7]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_long_octal;
  local_1b0.ptr_ = "17777777777L";
  local_1b0.length_ = 0xc;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"17777777777L\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))"
               ,0x4f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,local_1d0)) != 0x7fffffff) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (017777777777L)",0x24);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-9a-fA-FxX]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_long_cradix;
  local_1b0.ptr_ = "017777777777L";
  local_1b0.length_ = 0xd;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"0\" \"17777777777L\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
               ,0x5c);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,local_1d0)) != 0x7fffffff) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (017777777777L)",0x24);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-7]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_ulong_octal;
  local_1b0.ptr_ = "37777777777UL";
  local_1b0.length_ = 0xd;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x40,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"37777777777UL\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))"
               ,0x50);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,local_1d0)) != 0xffffffff) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x40,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (037777777777UL)",0x25);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-9a-fA-FxX]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_ulong_cradix;
  local_1b0.ptr_ = "037777777777UL";
  local_1b0.length_ = 0xe;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x40,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"0\" \"37777777777UL\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
               ,0x5d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,local_1d0)) != 0xffffffff) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x40,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (037777777777UL)",0x25);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-7]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_longlong_octal;
  local_1b0.ptr_ = "777777777777777777777LL";
  local_1b0.length_ = 0x17;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x41,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"777777777777777777777LL\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))"
               ,0x5a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,local_1d0)) != 0x7fffffffffffffff) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x41,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (0777777777777777777777LL)",0x2f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-9a-fA-FxX]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_longlong_cradix;
  local_1b0.ptr_ = "0777777777777777777777LL";
  local_1b0.length_ = 0x18;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x41,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"0\" \"777777777777777777777LL\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
               ,0x67);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,local_1d0)) != 0x7fffffffffffffff) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x41,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (0777777777777777777777LL)",0x2f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-7]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_ulonglong_octal;
  local_1b0.ptr_ = "1777777777777777777777ULL";
  local_1b0.length_ = 0x19;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x42,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"1777777777777777777777ULL\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))"
               ,0x5c);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,local_1d0)) != -1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x42,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (01777777777777777777777ULL)",0x31);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  RE2::RE2((RE2 *)&local_1a0,"([0-9a-fA-FxX]+)[uUlL]*");
  local_1c0.parser_ = RE2::Arg::parse_ulonglong_cradix;
  local_1b0.ptr_ = "01777777777777777777777ULL";
  local_1b0.length_ = 0x1a;
  local_1c8 = &local_1c0;
  local_1c0.arg_ = &local_1d0;
  bVar1 = RE2::FullMatchN(&local_1b0,(RE2 *)&local_1a0,&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x42,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::FullMatch(\"0\" \"1777777777777777777777ULL\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
               ,0x69);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,local_1d0)) != -1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x42,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (v) == (01777777777777777777777ULL)",0x31);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  return;
}

Assistant:

TEST(RE2, OctalTests) {
  VLOG(1) << "octal tests";

#define CHECK_OCTAL(type, value) \
  do { \
    type v; \
    CHECK(RE2::FullMatch(#value, "([0-7]+)[uUlL]*", RE2::Octal(&v))); \
    CHECK_EQ(v, 0 ## value); \
    CHECK(RE2::FullMatch("0" #value, "([0-9a-fA-FxX]+)[uUlL]*", RE2::CRadix(&v))); \
    CHECK_EQ(v, 0 ## value); \
  } while(0)

  CHECK_OCTAL(short,              77777);
  CHECK_OCTAL(unsigned short,     177777U);
  CHECK_OCTAL(int,                17777777777);
  CHECK_OCTAL(unsigned int,       37777777777U);
  CHECK_OCTAL(long,               17777777777L);
  CHECK_OCTAL(unsigned long,      37777777777UL);
  CHECK_OCTAL(long long,          777777777777777777777LL);
  CHECK_OCTAL(unsigned long long, 1777777777777777777777ULL);

#undef CHECK_OCTAL
}

TEST(RE2, DecimalTests) {
  VLOG(1) << "decimal tests";

#define CHECK_DECIMAL(type, value) \
  do { \
    type v; \
    CHECK(RE2::FullMatch(#value, "(-?[0-9]+)[uUlL]*", &v)); \
    CHECK_EQ(v, value); \
    CHECK(RE2::FullMatch(#value, "(-?[0-9a-fA-FxX]+)[uUlL]*", RE2::CRadix(&v))); \
    CHECK_EQ(v, value); \
  } while(0)

  CHECK_DECIMAL(short,              -1);
  CHECK_DECIMAL(unsigned short,     9999);
  CHECK_DECIMAL(int,                -1000);
  CHECK_DECIMAL(unsigned int,       12345U);
  CHECK_DECIMAL(long,               -10000000L);
  CHECK_DECIMAL(unsigned long,      3083324652U);
  CHECK_DECIMAL(long long,          -100000000000000LL);
  CHECK_DECIMAL(unsigned long long, 1234567890987654321ULL);

#undef CHECK_DECIMAL
}